

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

double getParaDescent(DoublePerlinNoise *para,double factor,int x,int z,int w,int h,int i0,int j0,
                     int maxrad,int maxiter,double alpha,void *data,
                     _func_int_void_ptr_int_int_double *func)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int c;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 local_b8 [16];
  
  dVar11 = sampleDoublePerlin(para,(double)(i0 + x),0.0,(double)(j0 + z));
  uVar15 = (undefined4)extraout_XMM0_Qb;
  uVar16 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
  dVar11 = dVar11 * factor;
  if ((func != (_func_int_void_ptr_int_int_double *)0x0) &&
     (iVar1 = (*func)(data,i0 + x,j0 + z,
                      (double)(~-(ulong)(factor < 0.0) & (ulong)dVar11 |
                              (ulong)-dVar11 & -(ulong)(factor < 0.0))), iVar1 != 0)) {
LAB_001165f4:
    dVar11 = nan("");
    return dVar11;
  }
  if (maxiter < 1) {
    return dVar11;
  }
  iVar8 = 0;
  uVar10 = -(ulong)(factor < 0.0);
  uVar6 = 0;
  uVar9 = 0;
  iVar1 = i0;
  iVar7 = j0;
  do {
    uVar9 = uVar9 + (uVar9 == 0);
    uVar14 = CONCAT44(uVar16,uVar15);
    dVar12 = dVar11;
    if ((int)(iVar1 + uVar9) < w && -1 < (int)(iVar1 + uVar9)) {
      dVar12 = sampleDoublePerlin(para,(double)(int)(x + uVar9 + iVar1),0.0,(double)(z + iVar7));
      dVar12 = dVar12 * factor;
      uVar14 = extraout_XMM0_Qb_00;
    }
    if (dVar12 < dVar11) {
LAB_00116735:
      uVar2 = (uint)((dVar11 - dVar12) * (double)(int)uVar9 * alpha);
      uVar4 = -uVar2;
      if (0 < (int)uVar2) {
        uVar4 = uVar2;
      }
      if ((uVar4 < 3) || (iVar5 = iVar1 + uVar2, w <= iVar5 || iVar5 < 0)) {
LAB_001167be:
        iVar5 = iVar1 + uVar9;
        uVar15 = (undefined4)uVar14;
        uVar16 = (undefined4)((ulong)uVar14 >> 0x20);
        dVar11 = dVar12;
      }
      else {
        dVar13 = sampleDoublePerlin(para,(double)(int)(uVar2 + x + iVar1),0.0,(double)(z + iVar7));
        uVar14 = 0;
        uVar15 = (undefined4)extraout_XMM0_Qb_02;
        uVar16 = (undefined4)((ulong)extraout_XMM0_Qb_02 >> 0x20);
        dVar11 = dVar13 * factor;
        if (dVar12 <= dVar13 * factor) goto LAB_001167be;
      }
      if ((func != (_func_int_void_ptr_int_int_double *)0x0) &&
         (iVar1 = (*func)(data,iVar5 + x,iVar7 + z,
                          (double)(~uVar10 & (ulong)dVar11 | (ulong)-dVar11 & uVar10)), iVar1 != 0))
      goto LAB_001165f4;
    }
    else {
      uVar14 = CONCAT44(uVar16,uVar15);
      dVar12 = dVar11;
      if ((int)(iVar1 - uVar9) < w && -1 < (int)(iVar1 - uVar9)) {
        dVar12 = sampleDoublePerlin(para,(double)(int)((x - uVar9) + iVar1),0.0,(double)(z + iVar7))
        ;
        dVar12 = dVar12 * factor;
        uVar14 = extraout_XMM0_Qb_01;
      }
      if (dVar12 < dVar11) {
        uVar9 = -uVar9;
        goto LAB_00116735;
      }
      uVar9 = 0;
      iVar5 = iVar1;
    }
    uVar6 = uVar6 + (uVar6 == 0);
    uVar14 = CONCAT44(uVar16,uVar15);
    dVar12 = dVar11;
    if ((int)(iVar7 + uVar6) < h && -1 < (int)(iVar7 + uVar6)) {
      dVar12 = sampleDoublePerlin(para,(double)(x + iVar5),0.0,(double)(int)(z + uVar6 + iVar7));
      dVar12 = dVar12 * factor;
      uVar14 = extraout_XMM0_Qb_03;
    }
    if (dVar12 < dVar11) {
LAB_0011690e:
      uVar2 = (uint)((dVar11 - dVar12) * (double)(int)uVar6 * alpha);
      uVar4 = -uVar2;
      if (0 < (int)uVar2) {
        uVar4 = uVar2;
      }
      if ((uVar4 < 3) || (iVar1 = iVar7 + uVar2, h <= iVar1 || iVar1 < 0)) {
LAB_0011699b:
        iVar1 = iVar7 + uVar6;
        local_b8._8_8_ = uVar14;
        local_b8._0_8_ = dVar12;
      }
      else {
        dVar11 = sampleDoublePerlin(para,(double)(x + iVar5),0.0,(double)(int)(uVar2 + z + iVar7));
        uVar14 = 0;
        local_b8._8_8_ = extraout_XMM0_Qb_05;
        local_b8._0_8_ = dVar11 * factor;
        if (dVar12 <= dVar11 * factor) goto LAB_0011699b;
      }
      iVar7 = iVar1;
      if (func != (_func_int_void_ptr_int_int_double *)0x0) {
        iVar1 = (*func)(data,iVar5 + x,iVar1 + z,
                        (double)(~uVar10 & local_b8._0_8_ |
                                (local_b8._0_8_ ^ 0x8000000000000000) & uVar10));
        if (iVar1 != 0) goto LAB_001165f4;
      }
    }
    else {
      uVar14 = CONCAT44(uVar16,uVar15);
      dVar12 = dVar11;
      if ((int)(iVar7 - uVar6) < h && -1 < (int)(iVar7 - uVar6)) {
        dVar12 = sampleDoublePerlin(para,(double)(x + iVar5),0.0,(double)(int)((z - uVar6) + iVar7))
        ;
        dVar12 = dVar12 * factor;
        uVar14 = extraout_XMM0_Qb_04;
      }
      if (dVar12 < dVar11) {
        uVar6 = -uVar6;
        goto LAB_0011690e;
      }
      uVar6 = 0;
      local_b8._8_4_ = uVar15;
      local_b8._0_8_ = dVar11;
      local_b8._12_4_ = uVar16;
    }
    dVar12 = local_b8._0_8_;
    if (uVar6 == 0 && uVar9 == 0) {
      uVar4 = 0;
      do {
        uVar9 = -(uVar4 & 1) | 1;
        iVar1 = uVar9 + iVar5;
        if (iVar1 < w && -1 < iVar1) {
          uVar6 = (uVar4 < 2) - 1 | 1;
          iVar3 = uVar6 + iVar7;
          if (iVar3 < h && -1 < iVar3) {
            dVar11 = sampleDoublePerlin(para,(double)(int)(x + iVar5 + uVar9),0.0,
                                        (double)(int)(z + iVar7 + uVar6));
            uVar15 = (undefined4)extraout_XMM0_Qb_06;
            uVar16 = (undefined4)((ulong)extraout_XMM0_Qb_06 >> 0x20);
            dVar11 = dVar11 * factor;
            if (dVar11 < dVar12) goto LAB_00116a23;
          }
        }
        uVar4 = uVar4 + 1;
        if (uVar4 == 4) {
          return dVar12;
        }
      } while( true );
    }
    uVar15 = local_b8._8_4_;
    uVar16 = local_b8._12_4_;
    iVar1 = iVar5;
    dVar11 = dVar12;
    iVar3 = iVar7;
LAB_00116a23:
    iVar5 = iVar1 - i0;
    iVar7 = -iVar5;
    if (0 < iVar5) {
      iVar7 = iVar5;
    }
    if (maxrad < iVar7) {
      return dVar11;
    }
    uVar2 = iVar3 - j0;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    if ((uint)maxrad < uVar4) {
      return dVar11;
    }
    iVar8 = iVar8 + 1;
    iVar7 = iVar3;
    if (iVar8 == maxiter) {
      return dVar11;
    }
  } while( true );
}

Assistant:

double getParaDescent(const DoublePerlinNoise *para, double factor,
    int x, int z, int w, int h, int i0, int j0, int maxrad,
    int maxiter, double alpha, void *data, int (*func)(void*,int,int,double))
{
    /// Do a gradient descent on a grid...
    /// To start with, we will just consider a step size of 1 in one axis:
    ///   Try going in positive x: if gradient is upwards go to negative x
    ///   then do the same with z - if all 4 directions go upwards then we have
    ///   found a minimum, otherwise repeat.
    /// We can remember and try the direction from the previous cycle first to
    /// reduce the number of wrong guesses.
    ///
    /// We can also use a larger step size than 1, as long as we believe that
    /// the minimum is not in between. To determine if this is viable, we check
    /// the step size of 1 first, and then jump if the gradient appears large
    /// enough in that direction.
    ///
    ///TODO:
    /// The perlin noise can be sampled continuously, so more established
    /// minima algorithms can also be considered...

    int dirx = 0, dirz = 0, dira;
    int k, i, j;
    double v, vd, va;
    v = factor * sampleDoublePerlin(para, x+i0, 0, z+j0);
    if (func)
    {
        if (func(data, x+i0, z+j0, factor < 0 ? -v : v))
            return nan("");
    }

    i = i0; j = j0;
    for (k = 0; k < maxiter; k++)
    {
        if (dirx == 0) dirx = +1;
        if (i+dirx >= 0 && i+dirx < w)
            vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j);
        else vd = v;
        if (vd >= v)
        {
            dirx *= -1;
            if (i+dirx >= 0 && i+dirx < w)
                vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j);
            else vd = v;
            if (vd >= v)
                dirx = 0;
        }
        if (dirx)
        {
            dira = (int)(dirx * alpha * (v - vd));
            if (abs(dira) > 2 && i+dira >= 0 && i+dira < w)
            {   // try jumping by more than 1
                va = factor * sampleDoublePerlin(para, x+i+dira, 0, z+j);
                if (va < vd)
                {
                    i += dira;
                    v = va;
                    goto L_x_end;
                }
            }
            v = vd;
            i += dirx;
        L_x_end:
            if (func)
            {
                if (func(data, x+i, z+j, factor < 0 ? -v : v))
                    return nan("");
            }
        }

        if (dirz == 0) dirz = +1;
        if (j+dirz >= 0 && j+dirz < h)
            vd = factor * sampleDoublePerlin(para, x+i, 0, z+j+dirz);
        else vd = v;
        if (vd >= v)
        {
            dirz *= -1;
            if (j+dirz >= 0 && j+dirz < h)
                vd = factor * sampleDoublePerlin(para, x+i, 0, z+j+dirz);
            else vd = v;
            if (vd >= v)
                dirz = 0;
        }
        if (dirz)
        {
            dira = (int)(dirz * alpha * (v - vd));
            if (abs(dira) > 2 && j+dira >= 0 && j+dira < h)
            {   // try jumping by more than 1
                va = factor * sampleDoublePerlin(para, x+i, 0, z+j+dira);
                if (va < vd)
                {
                    j += dira;
                    v = va;
                    goto L_z_end;
                }
            }
            j += dirz;
            v = vd;
        L_z_end:
            if (func)
            {
                if (func(data, x+i, z+j, factor < 0 ? -v : v))
                    return nan("");
            }
        }
        if (dirx == 0 && dirz == 0)
        {   // this is very likely a fix point
            // but there could be a minimum along a diagonal path in rare cases
            int c;
            for (c = 0; c < 4; c++)
            {
                dirx = (c & 1) ? -1 : +1;
                dirz = (c & 2) ? -1 : +1;
                if (i+dirx < 0 || i+dirx >= w || j+dirz < 0 || j+dirz >= h)
                    continue;
                vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j+dirz);
                if (vd < v)
                {
                    v = vd;
                    i += dirx;
                    j += dirz;
                    break;
                }
            }
            if (c >= 4)
                break;
        }
        if (abs(i - i0) > maxrad || abs(j - j0) > maxrad)
            break; // we have gone too far from the origin
    }

    return v;
}